

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O1

void InitRootMove(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  pointer pMVar4;
  Movement *pMVar8;
  UINT8 UVar9;
  UINT8 UVar10;
  UINT8 UVar11;
  undefined1 uVar12;
  UINT32 UVar13;
  UINT8 UVar14;
  UINT8 UVar15;
  undefined2 uVar16;
  UINT8 UVar17;
  undefined2 uVar18;
  UINT8 UVar19;
  undefined1 uVar20;
  bool bVar21;
  Movement *__i;
  Movement *pMVar22;
  Movement *pMVar23;
  int i;
  int iVar24;
  Movement *pMVar25;
  ulong uVar26;
  Movement *pMVar27;
  size_t __n;
  long lVar28;
  
  GetAllCaptureMovements(situation,num_of_all_movements,all_movements);
  CaptureValue(situation,num_of_all_movements,all_movements);
  iVar24 = *num_of_all_movements;
  uVar26 = (ulong)iVar24;
  if (uVar26 != 0) {
    pMVar27 = all_movements + uVar26;
    lVar28 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar28 == 0; lVar28 = lVar28 + -1) {
      }
    }
    std::
    __introsort_loop<Movement*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
              (all_movements,pMVar27,(ulong)(((uint)lVar28 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x105fda);
    if (iVar24 < 0x11) {
      if (iVar24 != 1) {
        pMVar22 = all_movements + 1;
        pMVar25 = all_movements;
        do {
          pMVar23 = pMVar22;
          uVar2 = pMVar23->value;
          if (all_movements->value < uVar2) {
            UVar14 = pMVar23->catc;
            UVar15 = pMVar23->movec;
            uVar16 = *(undefined2 *)&pMVar23->field_0xa;
            UVar9 = pMVar23->from;
            UVar10 = pMVar23->to;
            UVar11 = pMVar23->capture;
            uVar12 = pMVar23->field_0x3;
            UVar13 = pMVar23->value;
            memmove((void *)((long)pMVar25 + (0x18 - ((long)pMVar23 - (long)all_movements))),
                    all_movements,(long)pMVar23 - (long)all_movements);
            all_movements->from = UVar9;
            all_movements->to = UVar10;
            all_movements->capture = UVar11;
            all_movements->field_0x3 = uVar12;
            all_movements->value = UVar13;
            all_movements->catc = UVar14;
            all_movements->movec = UVar15;
            *(undefined2 *)&all_movements->field_0xa = uVar16;
          }
          else {
            UVar9 = pMVar25[1].from;
            UVar10 = pMVar25[1].to;
            UVar11 = pMVar25[1].capture;
            uVar12 = pMVar25[1].field_0x3;
            UVar14 = pMVar23->catc;
            UVar15 = pMVar23->movec;
            uVar16 = *(undefined2 *)&pMVar23->field_0xa;
            uVar1 = pMVar25->value;
            pMVar22 = pMVar23;
            while (uVar1 < uVar2) {
              UVar17 = pMVar22[-1].movec;
              uVar18 = *(undefined2 *)&pMVar22[-1].field_0xa;
              pMVar22->catc = pMVar22[-1].catc;
              pMVar22->movec = UVar17;
              *(undefined2 *)&pMVar22->field_0xa = uVar18;
              UVar17 = pMVar22[-1].to;
              UVar19 = pMVar22[-1].capture;
              uVar20 = pMVar22[-1].field_0x3;
              UVar13 = pMVar22[-1].value;
              pMVar22->from = pMVar22[-1].from;
              pMVar22->to = UVar17;
              pMVar22->capture = UVar19;
              pMVar22->field_0x3 = uVar20;
              pMVar22->value = UVar13;
              uVar1 = pMVar22[-2].value;
              pMVar22 = pMVar22 + -1;
            }
            pMVar22->from = UVar9;
            pMVar22->to = UVar10;
            pMVar22->capture = UVar11;
            pMVar22->field_0x3 = uVar12;
            pMVar22->value = uVar2;
            pMVar22->catc = UVar14;
            pMVar22->movec = UVar15;
            *(undefined2 *)&pMVar22->field_0xa = uVar16;
          }
          pMVar22 = pMVar23 + 1;
          pMVar25 = pMVar23;
        } while (pMVar23 + 1 != pMVar27);
      }
    }
    else {
      pMVar22 = all_movements + 1;
      __n = 0xc;
      pMVar25 = all_movements;
      do {
        pMVar23 = (Movement *)(&all_movements->from + __n);
        uVar2 = *(uint *)((long)&all_movements->value + __n);
        if (all_movements->value < uVar2) {
          UVar14 = pMVar23->catc;
          UVar15 = pMVar23->movec;
          uVar16 = *(undefined2 *)&pMVar23->field_0xa;
          UVar9 = pMVar23->from;
          UVar10 = pMVar23->to;
          UVar11 = pMVar23->capture;
          uVar12 = pMVar23->field_0x3;
          UVar13 = pMVar23->value;
          memmove((void *)((long)pMVar25 + (0x18 - __n)),all_movements,__n);
          all_movements->from = UVar9;
          all_movements->to = UVar10;
          all_movements->capture = UVar11;
          all_movements->field_0x3 = uVar12;
          all_movements->value = UVar13;
          all_movements->catc = UVar14;
          all_movements->movec = UVar15;
          *(undefined2 *)&all_movements->field_0xa = uVar16;
        }
        else {
          UVar9 = pMVar23->from;
          UVar10 = pMVar23->to;
          UVar11 = pMVar23->capture;
          uVar12 = pMVar23->field_0x3;
          UVar14 = pMVar23->catc;
          UVar15 = pMVar23->movec;
          uVar16 = *(undefined2 *)&pMVar23->field_0xa;
          uVar1 = pMVar25->value;
          pMVar25 = pMVar23;
          pMVar8 = pMVar22;
          while (uVar1 < uVar2) {
            pMVar25 = pMVar8 + -1;
            UVar17 = pMVar8[-1].movec;
            uVar18 = *(undefined2 *)&pMVar8[-1].field_0xa;
            pMVar8->catc = pMVar8[-1].catc;
            pMVar8->movec = UVar17;
            *(undefined2 *)&pMVar8->field_0xa = uVar18;
            UVar17 = pMVar8[-1].to;
            UVar19 = pMVar8[-1].capture;
            uVar20 = pMVar8[-1].field_0x3;
            UVar13 = pMVar8[-1].value;
            pMVar8->from = pMVar8[-1].from;
            pMVar8->to = UVar17;
            pMVar8->capture = UVar19;
            pMVar8->field_0x3 = uVar20;
            pMVar8->value = UVar13;
            uVar1 = pMVar8[-2].value;
            pMVar8 = pMVar25;
          }
          pMVar25->from = UVar9;
          pMVar25->to = UVar10;
          pMVar25->capture = UVar11;
          pMVar25->field_0x3 = uVar12;
          pMVar25->value = uVar2;
          pMVar25->catc = UVar14;
          pMVar25->movec = UVar15;
          *(undefined2 *)&pMVar25->field_0xa = uVar16;
        }
        __n = __n + 0xc;
        pMVar22 = pMVar22 + 1;
        pMVar25 = pMVar23;
      } while (__n != 0xc0);
      pMVar22 = all_movements + 0x10;
      do {
        UVar9 = pMVar22->from;
        UVar10 = pMVar22->to;
        UVar11 = pMVar22->capture;
        uVar12 = pMVar22->field_0x3;
        uVar3 = pMVar22->value;
        uVar5 = pMVar22->catc;
        uVar6 = pMVar22->movec;
        uVar7 = *(undefined2 *)&pMVar22->field_0xa;
        uVar2 = pMVar22[-1].value;
        pMVar25 = pMVar22;
        while (uVar2 < (uint)uVar3) {
          UVar14 = pMVar25[-1].movec;
          uVar16 = *(undefined2 *)&pMVar25[-1].field_0xa;
          pMVar25->catc = pMVar25[-1].catc;
          pMVar25->movec = UVar14;
          *(undefined2 *)&pMVar25->field_0xa = uVar16;
          UVar14 = pMVar25[-1].to;
          UVar15 = pMVar25[-1].capture;
          uVar20 = pMVar25[-1].field_0x3;
          UVar13 = pMVar25[-1].value;
          pMVar25->from = pMVar25[-1].from;
          pMVar25->to = UVar14;
          pMVar25->capture = UVar15;
          pMVar25->field_0x3 = uVar20;
          pMVar25->value = UVar13;
          uVar2 = pMVar25[-2].value;
          pMVar25 = pMVar25 + -1;
        }
        pMVar25->from = UVar9;
        pMVar25->to = UVar10;
        pMVar25->capture = UVar11;
        pMVar25->field_0x3 = uVar12;
        pMVar25->value = uVar3;
        pMVar25->catc = uVar5;
        pMVar25->movec = uVar6;
        *(undefined2 *)&pMVar25->field_0xa = uVar7;
        pMVar22 = pMVar22 + 1;
      } while (pMVar22 != pMVar27);
    }
  }
  iVar24 = *num_of_all_movements;
  GetAllNotCaptureMovements(situation,num_of_all_movements,all_movements);
  for (; iVar24 < *num_of_all_movements; iVar24 = iVar24 + 1) {
    lVar28 = (long)iVar24;
    pMVar27 = all_movements + lVar28;
    bVar21 = MakeAMove(situation,pMVar27,true);
    if (bVar21) {
      uVar26 = (ulong)(*num_of_all_movements - 1U);
      if (iVar24 < (int)(*num_of_all_movements - 1U)) {
        do {
          lVar28 = lVar28 + 1;
          UVar9 = pMVar27[1].movec;
          uVar16 = *(undefined2 *)&pMVar27[1].field_0xa;
          pMVar27->catc = pMVar27[1].catc;
          pMVar27->movec = UVar9;
          *(undefined2 *)&pMVar27->field_0xa = uVar16;
          UVar9 = pMVar27[1].to;
          UVar10 = pMVar27[1].capture;
          uVar12 = pMVar27[1].field_0x3;
          UVar13 = pMVar27[1].value;
          pMVar27->from = pMVar27[1].from;
          pMVar27->to = UVar9;
          pMVar27->capture = UVar10;
          pMVar27->field_0x3 = uVar12;
          pMVar27->value = UVar13;
          pMVar27 = pMVar27 + 1;
          uVar26 = (long)*num_of_all_movements - 1;
        } while (lVar28 < (long)uVar26);
      }
      *num_of_all_movements = (int)uVar26;
      iVar24 = iVar24 + -1;
    }
    UnMakeAMove(situation);
  }
  pMVar4 = (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar4;
  }
  return;
}

Assistant:

void InitRootMove(Situation& situation, int& num_of_all_movements, Movement* all_movements){
    // 吃子着法
    GetAllCaptureMovements(situation, num_of_all_movements, all_movements);
    CaptureValue(situation, num_of_all_movements, all_movements);
    std::sort(all_movements, all_movements + num_of_all_movements, cmp);
    int numofnocap = num_of_all_movements;
    // 不吃子着法
    GetAllNotCaptureMovements(situation, num_of_all_movements, all_movements);
    for(int i = numofnocap; i < num_of_all_movements; i ++){
        if(MakeAMove(situation, all_movements[i], 1)){
            // std::cout << "remove " << int(all_movements[i].from) << " " << int(all_movements[i].to) << " \n";
            for(int j = i; j < num_of_all_movements - 1; j ++){
                all_movements[j] = all_movements[j + 1];
            }
            num_of_all_movements --;
            i--;
        }
        UnMakeAMove(situation);
    }
    situation.moves_stack.clear();
}